

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

void Saig_ManCbaShrink(Saig_ManCba_t *p)

{
  Vec_Vec_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  Vec_Int_t *p_01;
  Aig_Man_t *pAVar8;
  int Lit;
  int ObjId;
  int k;
  int f;
  Vec_Int_t *vLevel2;
  Vec_Int_t *vLevel;
  Aig_Obj_t *pObjFrame;
  Aig_Obj_t *pObjLi;
  Aig_Man_t *pManNew;
  Saig_ManCba_t *p_local;
  
  ObjId = 0;
  do {
    iVar1 = Vec_VecSize(p->vReg2Frame);
    if (iVar1 <= ObjId) {
      for (Lit = 0; iVar1 = Vec_VecSize(p->vReg2Frame), Lit < iVar1; Lit = Lit + 1) {
        pVVar7 = Vec_VecEntryInt(p->vReg2Frame,Lit);
        p_01 = Vec_VecEntryInt(p->vReg2Value,Lit);
        iVar1 = Vec_IntSize(pVVar7);
        iVar2 = Vec_IntSize(pVVar7);
        iVar3 = Aig_ManRegNum(p->pAig);
        uVar4 = Vec_IntSize(p_01);
        iVar5 = Vec_IntSize(p_01);
        iVar6 = Aig_ManRegNum(p->pAig);
        printf("Level = %4d   StateBits = %4d (%6.2f %%)  CareBits = %4d (%6.2f %%)\n",
               ((double)(iVar2 / 2) * 100.0) / (double)iVar3,((double)iVar5 * 100.0) / (double)iVar6
               ,(ulong)(uint)Lit,(ulong)(uint)(iVar1 / 2),(ulong)uVar4);
      }
      pAVar8 = Saig_ManDupWithCubes(p->pAig,p->vReg2Value);
      Aig_ManStop(pAVar8);
      return;
    }
    pVVar7 = Vec_VecEntryInt(p->vReg2Frame,ObjId);
    for (Lit = 0; iVar1 = Vec_IntSize(pVVar7), Lit + 1 < iVar1; Lit = Lit + 2) {
      iVar1 = Vec_IntEntry(pVVar7,Lit);
      iVar2 = Vec_IntEntry(pVVar7,Lit + 1);
      pAVar8 = p->pFrames;
      iVar3 = Abc_Lit2Var(iVar2);
      pObj = Aig_ManObj(pAVar8,iVar3);
      if ((pObj != (Aig_Obj_t *)0x0) &&
         ((iVar3 = Aig_ObjIsConst1(pObj), iVar3 != 0 ||
          (iVar3 = Aig_ObjIsTravIdCurrent(p->pFrames,pObj), iVar3 != 0)))) {
        pObj_00 = Aig_ManObj(p->pAig,iVar1);
        iVar1 = Saig_ObjIsLi(p->pAig,pObj_00);
        if (iVar1 == 0) {
          __assert_fail("Saig_ObjIsLi(p->pAig, pObjLi)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldCex.c"
                        ,0x23a,"void Saig_ManCbaShrink(Saig_ManCba_t *)");
        }
        p_00 = p->vReg2Value;
        iVar1 = Aig_ObjCioId(pObj_00);
        iVar3 = Saig_ManPoNum(p->pAig);
        uVar4 = Abc_LitIsCompl(iVar2);
        iVar1 = Abc_Var2Lit(iVar1 - iVar3,
                            uVar4 ^ ((*(ulong *)&pObj->field_0x18 >> 3 & 1) != 0 ^ 0xffU) & 1);
        Vec_VecPushInt(p_00,ObjId,iVar1);
      }
    }
    ObjId = ObjId + 1;
  } while( true );
}

Assistant:

void Saig_ManCbaShrink( Saig_ManCba_t * p )
{
    Aig_Man_t * pManNew;
    Aig_Obj_t * pObjLi, * pObjFrame;
    Vec_Int_t * vLevel, * vLevel2;
    int f, k, ObjId, Lit;
    // assuming that important objects are labeled in Saig_ManCbaFindReason()
    Vec_VecForEachLevelInt( p->vReg2Frame, vLevel, f )
    {
        Vec_IntForEachEntryDouble( vLevel, ObjId, Lit, k )
        {
            pObjFrame = Aig_ManObj( p->pFrames, Abc_Lit2Var(Lit) );
            if ( pObjFrame == NULL || (!Aig_ObjIsConst1(pObjFrame) && !Aig_ObjIsTravIdCurrent(p->pFrames, pObjFrame)) )
                continue;
            pObjLi = Aig_ManObj( p->pAig, ObjId );
            assert( Saig_ObjIsLi(p->pAig, pObjLi) );
            Vec_VecPushInt( p->vReg2Value, f, Abc_Var2Lit( Aig_ObjCioId(pObjLi) - Saig_ManPoNum(p->pAig), Abc_LitIsCompl(Lit) ^ !pObjFrame->fPhase ) );
        }
    }
    // print statistics
    Vec_VecForEachLevelInt( p->vReg2Frame, vLevel, k )
    {
        vLevel2 = Vec_VecEntryInt( p->vReg2Value, k );
        printf( "Level = %4d   StateBits = %4d (%6.2f %%)  CareBits = %4d (%6.2f %%)\n", k, 
            Vec_IntSize(vLevel)/2, 100.0 * (Vec_IntSize(vLevel)/2) / Aig_ManRegNum(p->pAig),
            Vec_IntSize(vLevel2),  100.0 * Vec_IntSize(vLevel2) / Aig_ManRegNum(p->pAig) );
    }
    // try reducing the frames
    pManNew = Saig_ManDupWithCubes( p->pAig, p->vReg2Value );
//    Ioa_WriteAiger( pManNew, "aigcube.aig", 0, 0 );
    Aig_ManStop( pManNew );
}